

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O1

BaseState<true> * __thiscall MultiState<true>::StartArray(MultiState<true> *this,Context<true> *ctx)

{
  vw_exception *this_00;
  stringstream __msg;
  string local_1c0;
  cb_class local_1a0;
  ostream local_190;
  
  if (ctx->all->label_type == cb) {
    local_1a0.cost = 3.4028235e+38;
    local_1a0.action = 0x15563460;
    local_1a0.probability = -1.0;
    local_1a0.partial_prediction = 0.0;
    v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)&(ctx->ex->l).simple,&local_1a0);
    return &this->super_BaseState<true>;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(&local_190,"label type is not CB",0x14);
  this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_example_json.h"
             ,0x19e,&local_1c0);
  __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

BaseState<audit>* StartArray(Context<audit>& ctx)
  {
    // mark shared example
    if (ctx.all->label_type == label_type::cb)
    {
      CB::label* ld = &ctx.ex->l.cb;
      CB::cb_class f;

      f.partial_prediction = 0.;
      f.action = (uint32_t)uniform_hash("shared", 6, 0);
      f.cost = FLT_MAX;
      f.probability = -1.f;

      ld->costs.push_back(f);
    }
    else
      THROW("label type is not CB")

    return this;
  }